

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecAtt.h
# Opt level: O0

void * Vec_AttFree(Vec_Att_t *p,int fFreeMan)

{
  Vec_Att_t *local_38;
  int local_2c;
  int i;
  void *pMan;
  int fFreeMan_local;
  Vec_Att_t *p_local;
  
  if (p == (Vec_Att_t *)0x0) {
    p_local = (Vec_Att_t *)0x0;
  }
  else {
    if (p->pFuncFreeObj != (_func_void_void_ptr_void_ptr *)0x0) {
      for (local_2c = 0; local_2c < p->nCap; local_2c = local_2c + 1) {
        if (p->pArrayPtr[local_2c] != (void *)0x0) {
          (*p->pFuncFreeObj)(p->pMan,p->pArrayPtr[local_2c]);
        }
      }
    }
    if (fFreeMan == 0) {
      local_38 = (Vec_Att_t *)p->pMan;
    }
    else {
      local_38 = (Vec_Att_t *)0x0;
    }
    if ((p->pMan != (void *)0x0) && (fFreeMan != 0)) {
      (*p->pFuncFreeMan)(p->pMan);
    }
    if (p->pArrayPtr != (void **)0x0) {
      free(p->pArrayPtr);
      p->pArrayPtr = (void **)0x0;
    }
    if (p != (Vec_Att_t *)0x0) {
      free(p);
    }
    p_local = local_38;
  }
  return p_local;
}

Assistant:

static inline void * Vec_AttFree( Vec_Att_t * p, int fFreeMan )
{
    void * pMan;
    if ( p == NULL )
        return NULL;
    // free the attributes of objects
    if ( p->pFuncFreeObj )
    {
        int i;
        for ( i = 0; i < p->nCap; i++ )
            if ( p->pArrayPtr[i] )
                p->pFuncFreeObj( p->pMan, p->pArrayPtr[i] );
    }
    // free the memory manager
    pMan = fFreeMan? NULL : p->pMan;
    if ( p->pMan && fFreeMan )  
        p->pFuncFreeMan( p->pMan );
    ABC_FREE( p->pArrayPtr );
    ABC_FREE( p );
    return pMan;
}